

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btSimpleDynamicsWorld::integrateTransforms(btSimpleDynamicsWorld *this,btScalar timeStep)

{
  bool bVar1;
  int iVar2;
  btRigidBody *this_00;
  long in_RDI;
  btRigidBody *body;
  btCollisionObject *colObj;
  int i;
  btTransform predictedTrans;
  undefined4 in_stack_ffffffffffffff88;
  btScalar in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  int local_50;
  
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_50 = 0;
  while (iVar3 = local_50,
        iVar2 = btAlignedObjectArray<btCollisionObject_*>::size
                          ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8)), iVar3 < iVar2
        ) {
    btAlignedObjectArray<btCollisionObject_*>::operator[]
              ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8),local_50);
    this_00 = btRigidBody::upcast((btCollisionObject *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (((this_00 != (btRigidBody *)0x0) &&
        (bVar1 = btCollisionObject::isActive
                           ((btCollisionObject *)CONCAT44(iVar3,in_stack_ffffffffffffff90)), bVar1))
       && (bVar1 = btCollisionObject::isStaticObject(&this_00->super_btCollisionObject), !bVar1)) {
      btRigidBody::predictIntegratedTransform
                ((btRigidBody *)CONCAT44(iVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,
                 (btTransform *)0x232f63);
      btRigidBody::proceedToTransform
                ((btRigidBody *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                 (btTransform *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	btTransform predictedTrans;
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			if (body->isActive() && (!body->isStaticObject()))
			{
				body->predictIntegratedTransform(timeStep, predictedTrans);
				body->proceedToTransform( predictedTrans);
			}
		}
	}
}